

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

Mat3x3d * __thiscall
OpenMD::HydroProp::getPitchMatrix(Mat3x3d *__return_storage_ptr__,HydroProp *this)

{
  RectMatrix<double,_3U,_3U> *m;
  RectMatrix<double,_3U,_3U> local_1d0;
  Mat3x3d local_188;
  OpenMD local_140 [72];
  RectMatrix<double,_3U,_3U> local_f8;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  SquareMatrix<double,_3>::SquareMatrix(&__return_storage_ptr__->super_SquareMatrix<double,_3>);
  getXitt(&local_188,this);
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_140,&local_188);
  operator-(&local_f8,local_140,m);
  getXirt((Mat3x3d *)&local_1d0,this);
  operator*(&local_b0,&local_f8,&local_1d0);
  RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_b0);
  SquareMatrix3<double>::operator=(__return_storage_ptr__,(SquareMatrix<double,_3> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d HydroProp::getPitchMatrix() {
    Mat3x3d P;
    P = -getXitt().inverse() * getXirt();
    return P;
  }